

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O2

Vec_Ptr_t * Aig_ManTernarySimulate(Aig_Man_t *p,int fVerbose,int fVeryVerbose)

{
  byte bVar1;
  bool bVar2;
  Aig_Tsi_t *p_00;
  void *pvVar3;
  uint *puVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong local_48;
  
  p_00 = Aig_TsiStart(p);
  p->pConst1->field_0x1f = 2;
  for (iVar13 = 0; iVar10 = p->nObjs[2] - p->nRegs, iVar13 < iVar10; iVar13 = iVar13 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,iVar13);
    *(ulong *)((long)pvVar3 + 0x18) =
         *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffff | 0x300000000000000;
  }
  for (; iVar10 < p->vCis->nSize; iVar10 = iVar10 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,iVar10);
    *(ulong *)((long)pvVar3 + 0x18) =
         (*(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffff) + 0x100000000000000;
  }
  local_48 = 0x100000000000000;
  uVar14 = 0;
  while( true ) {
    if (uVar14 == 1000) {
      printf("Aig_ManTernarySimulate(): Did not reach a fixed point after %d iterations (not a bug).\n"
             ,1000);
      Aig_TsiStop(p_00);
      return (Vec_Ptr_t *)0x0;
    }
    puVar4 = Aig_TsiStateNew(p_00);
    bVar11 = 0;
    for (uVar12 = 0; (int)uVar12 < p->nRegs; uVar12 = uVar12 + 1) {
      Aig_ManLi(p,uVar12);
      pAVar5 = Aig_ManLo(p,uVar12);
      bVar1 = pAVar5->field_0x1f;
      if ((bVar1 & 1) != 0) {
        puVar4[uVar12 >> 4] = puVar4[uVar12 >> 4] | 1 << (bVar11 & 0x1e);
      }
      if ((bVar1 & 2) != 0) {
        puVar4[uVar12 >> 4] = puVar4[uVar12 >> 4] | 2 << (bVar11 & 0x1e);
      }
      bVar11 = bVar11 + 2;
    }
    if (fVeryVerbose != 0) {
      printf("%3d : ",(ulong)uVar14);
      Aig_TsiStatePrint(p_00,puVar4);
    }
    iVar13 = p_00->nWords;
    iVar10 = Aig_TsiStateLookup(p_00,puVar4,iVar13);
    if (iVar10 != 0) break;
    Aig_TsiStateInsert(p_00,puVar4,iVar13);
    for (iVar13 = 0; iVar13 < p->vObjs->nSize; iVar13 = iVar13 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar13);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
        iVar10 = Aig_ObjGetXsimFanin0(pAVar5);
        bVar11 = *(byte *)(((ulong)pAVar5->pFanin1 & 0xfffffffffffffffe) + 0x1f);
        uVar12 = (uint)bVar11;
        if (((ulong)pAVar5->pFanin1 & 1) != 0) {
          uVar12 = Aig_XsimInv((uint)bVar11);
        }
        uVar8 = local_48;
        if ((((iVar10 != 1) && (uVar8 = 0x100000000000000, uVar12 != 1)) &&
            (uVar8 = 0x300000000000000, iVar10 != 3)) &&
           ((uVar12 != 3 && ((iVar10 != 2 || (uVar8 = 0x200000000000000, uVar12 != 2)))))) {
          __assert_fail("Value0 == AIG_XVS1 && Value1 == AIG_XVS1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTsim.c"
                        ,0x37,"int Aig_XsimAnd(int, int)");
        }
        *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffff | uVar8;
      }
    }
    for (iVar13 = p->nObjs[3] - p->nRegs; iVar13 < p->vCos->nSize; iVar13 = iVar13 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar13);
      uVar12 = Aig_ObjGetXsimFanin0(pAVar5);
      *(ulong *)&pAVar5->field_0x18 =
           *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffff | (ulong)uVar12 << 0x38;
    }
    for (iVar13 = 0; iVar13 < p->nRegs; iVar13 = iVar13 + 1) {
      pAVar5 = Aig_ManLi(p,iVar13);
      pAVar6 = Aig_ManLo(p,iVar13);
      if (uVar14 < 300) {
        uVar9 = *(ulong *)&pAVar5->field_0x18 & 0xff00000000000000;
        uVar8 = *(ulong *)&pAVar6->field_0x18;
LAB_00583c70:
        *(ulong *)&pAVar6->field_0x18 = uVar8 & 0xffffffffffffff | uVar9;
      }
      else {
        uVar8 = *(ulong *)&pAVar6->field_0x18;
        if (0xffffffffffffff < (*(ulong *)&pAVar5->field_0x18 ^ uVar8)) {
          uVar9 = 0x300000000000000;
          goto LAB_00583c70;
        }
      }
    }
    uVar14 = uVar14 + 1;
  }
  bVar2 = false;
  puVar4 = (uint *)Vec_PtrEntry(p_00->vStates,0);
  Aig_TsiStateOrAll(p_00,puVar4);
  uVar12 = p_00->nWords;
  iVar13 = uVar12 * 0x20 + p->nRegs * -2;
  if (iVar13 == 0) {
    uVar9 = 0;
    uVar8 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar8 = uVar9;
    }
    bVar2 = false;
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      if (puVar4[uVar9] != 0xffffffff) {
        bVar2 = true;
      }
    }
  }
  else {
    if ((int)uVar12 < 2) {
      uVar12 = 1;
    }
    for (uVar8 = 0; uVar12 - 1 != uVar8; uVar8 = uVar8 + 1) {
      if (puVar4[uVar8] != 0xffffffff) {
        bVar2 = true;
      }
    }
    if (puVar4[uVar12 - 1] != 0xffffffffU >> ((byte)iVar13 & 0x1f)) goto LAB_00583d29;
  }
  if (!bVar2) {
    if (fVerbose != 0) {
      printf("Detected 0 constants after %d iterations of ternary simulation.\n",(ulong)uVar14);
    }
    Aig_TsiStop(p_00);
    return (Vec_Ptr_t *)0x0;
  }
LAB_00583d29:
  pVVar7 = Vec_PtrAlloc(p->nObjs[2]);
  for (iVar13 = 0; iVar13 < p->nObjs[2] - p->nRegs; iVar13 = iVar13 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,iVar13);
    Vec_PtrPush(pVVar7,pvVar3);
  }
  if (p->nRegs < 1) {
    Aig_TsiStop(p_00);
    if (fVerbose == 0) {
      return pVVar7;
    }
    printf("Detected %d constants after %d iterations of ternary simulation.\n",0,(ulong)uVar14);
    return pVVar7;
  }
  Aig_ManLi(p,0);
  Aig_ManLo(p,0);
  pVVar7 = (Vec_Ptr_t *)
           (*(code *)(&DAT_00842f50 +
                     *(int *)(&DAT_00842f50 +
                             (ulong)((uint)((*puVar4 & 1) != 0) + (*puVar4 >> 1 & 1) * 2) * 4)))();
  return pVVar7;
}

Assistant:

Vec_Ptr_t * Aig_ManTernarySimulate( Aig_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Aig_Tsi_t * pTsi;
    Vec_Ptr_t * vMap;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    unsigned * pState;//, * pPrev;
    int i, f, fConstants, Value, nCounter, nRetired;
    // allocate the simulation manager
    pTsi = Aig_TsiStart( p );
    // initialize the values
    Aig_ObjSetXsim( Aig_ManConst1(p), AIG_XVS1 );
    Aig_ManForEachPiSeq( p, pObj, i )
        Aig_ObjSetXsim( pObj, AIG_XVSX );
    Aig_ManForEachLoSeq( p, pObj, i )
        Aig_ObjSetXsim( pObj, AIG_XVS0 );
    // simulate for the given number of timeframes
    for ( f = 0; f < TSI_MAX_ROUNDS; f++ )
    {
        // collect this state
        pState = Aig_TsiStateNew( pTsi );
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        {
            Value = Aig_ObjGetXsim(pObjLo);
            if ( Value & 1 )
                Abc_InfoSetBit( pState, 2 * i );
            if ( Value & 2 )
                Abc_InfoSetBit( pState, 2 * i + 1 );
        }

//        printf( "%d ", Aig_TsiStateCount(pTsi, pState) );
if ( fVeryVerbose )
{
printf( "%3d : ", f );
Aig_TsiStatePrint( pTsi, pState );
}
        // check if this state exists
        if ( Aig_TsiStateLookup( pTsi, pState, pTsi->nWords ) )
            break;
//        nCounter = 0;
//        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
//            nCounter += (Aig_ObjGetXsim(pObjLo) == AIG_XVS0);
//printf( "%d -> ", nCounter );
        // insert this state
        Aig_TsiStateInsert( pTsi, pState, pTsi->nWords );
        // simulate internal nodes
        Aig_ManForEachNode( p, pObj, i )
        {
            Aig_ObjSetXsim( pObj, Aig_XsimAnd(Aig_ObjGetXsimFanin0(pObj), Aig_ObjGetXsimFanin1(pObj)) );
//            printf( "%d %d    Id = %2d.  Value = %d.\n", 
//                Aig_ObjGetXsimFanin0(pObj), Aig_ObjGetXsimFanin1(pObj),
//                i, Aig_XsimAnd(Aig_ObjGetXsimFanin0(pObj), Aig_ObjGetXsimFanin1(pObj)) );
        }
        // transfer the latch values
        Aig_ManForEachLiSeq( p, pObj, i )
            Aig_ObjSetXsim( pObj, Aig_ObjGetXsimFanin0(pObj) );
        nCounter = 0;
        nRetired = 0;
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        {
            if ( f < TSI_ONE_SERIES )
                Aig_ObjSetXsim( pObjLo, Aig_ObjGetXsim(pObjLi) );
            else
            {
                if ( Aig_ObjGetXsim(pObjLi) != Aig_ObjGetXsim(pObjLo) )
                {
                    Aig_ObjSetXsim( pObjLo, AIG_XVSX );
                    nRetired++;
                }
            }
            nCounter += (Aig_ObjGetXsim(pObjLo) == AIG_XVS0);
        }
//        if ( nRetired )
//        printf( "Retired %d registers.\n", nRetired );

//        if ( f && (f % 1000 == 0) )
//            printf( "%d \n", f );
//printf( "%d  ", nCounter );
    }
//printf( "\n" );
    if ( f == TSI_MAX_ROUNDS )
    {
        printf( "Aig_ManTernarySimulate(): Did not reach a fixed point after %d iterations (not a bug).\n", TSI_MAX_ROUNDS );
        Aig_TsiStop( pTsi );
        return NULL;
    }
    // OR all the states
    pState = (unsigned *)Vec_PtrEntry( pTsi->vStates, 0 );
    Aig_TsiStateOrAll( pTsi, pState );
    // check if there are constants
    fConstants = 0;
    if ( 2*Aig_ManRegNum(p) == 32*pTsi->nWords )
    {
        for ( i = 0; i < pTsi->nWords; i++ )
            if ( pState[i] != ~0 )
                fConstants = 1;
    }
    else
    {
        for ( i = 0; i < pTsi->nWords - 1; i++ )
            if ( pState[i] != ~0 )
                fConstants = 1;
        if ( pState[i] != Abc_InfoMask( 2*Aig_ManRegNum(p) - 32*(pTsi->nWords-1) ) )
            fConstants = 1;
    }
    if ( fConstants == 0 )
    {
        if ( fVerbose )
        printf( "Detected 0 constants after %d iterations of ternary simulation.\n", f );
        Aig_TsiStop( pTsi );
        return NULL;
    }

    // start mapping by adding the true PIs
    vMap = Vec_PtrAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Vec_PtrPush( vMap, pObj );
    // find constant registers
    nCounter = 0;
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
        nCounter += (Value == 1 || Value == 2);
        if ( Value == 1 )
            Vec_PtrPush( vMap, Aig_ManConst0(p) );
        else if ( Value == 2 )
            Vec_PtrPush( vMap, Aig_ManConst1(p) );
        else if ( Value == 3 )
            Vec_PtrPush( vMap, pObjLo );
        else
            assert( 0 );
//        Aig_XsimPrint( stdout, Value );
    }
//    printf( "\n" );
    Aig_TsiStop( pTsi );
    if ( fVerbose )
    printf( "Detected %d constants after %d iterations of ternary simulation.\n", nCounter, f );
    return vMap;
}